

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall CCamera::OnRender(CCamera *this)

{
  vec2 vVar1;
  CNetObj_PlayerInfo *pCVar2;
  int iVar3;
  CGameClient *pCVar4;
  vec2 vVar5;
  IClient *pIVar6;
  CConfig *pCVar7;
  float fVar8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  vector2_base<float> vVar10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar11;
  float fVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar13;
  vec2 vVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float local_28;
  float fStack_24;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar20;
  
  pCVar4 = (this->super_CComponent).m_pClient;
  pIVar6 = pCVar4->m_pClient;
  if (pIVar6->m_State - 3U < 2) {
    this->m_Zoom = 1.0;
    if ((((pCVar4->m_Snap).m_SpecInfo.m_Active == true) &&
        ((pCVar4->m_Snap).m_SpecInfo.m_UsePosition == false)) &&
       (((pCVar4->m_Snap).m_SpecInfo.m_SpecMode == 0 ||
        ((pCVar2 = (pCVar4->m_Snap).m_pLocalInfo, pCVar2 != (CNetObj_PlayerInfo *)0x0 &&
         ((pCVar2->m_PlayerFlags & 0x10) == 0)))))) {
      if (this->m_CamType != 0) {
        pCVar4->m_pControls->m_MousePos = this->m_PrevCenter;
        CControls::ClampMousePos(((this->super_CComponent).m_pClient)->m_pControls);
        this->m_CamType = 0;
        pCVar4 = (this->super_CComponent).m_pClient;
      }
      vVar5 = pCVar4->m_pControls->m_MousePos;
      this->m_Center = vVar5;
      goto LAB_0012c6cc;
    }
    if (this->m_CamType != 1) {
      CControls::ClampMousePos(pCVar4->m_pControls);
      this->m_CamType = 1;
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pClient;
    }
    fVar17 = pIVar6->m_RenderFrameTime;
    if ((OnRender()::s_LastMousePos == '\0') &&
       (iVar3 = __cxa_guard_acquire(&OnRender()::s_LastMousePos), iVar3 != 0)) {
      OnRender::s_LastMousePos.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
      OnRender::s_LastMousePos.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
      __cxa_guard_release(&OnRender()::s_LastMousePos);
    }
    if ((OnRender()::s_CurrentCameraOffset == '\0') &&
       (iVar3 = __cxa_guard_acquire(&OnRender()::s_CurrentCameraOffset), iVar3 != 0)) {
      OnRender::s_CurrentCameraOffset.field_0 =
           (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
      OnRender::s_CurrentCameraOffset.field_1 =
           (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
      __cxa_guard_release(&OnRender()::s_CurrentCameraOffset);
    }
    pCVar4 = (this->super_CComponent).m_pClient;
    pCVar7 = pCVar4->m_pConfig;
    if (0 < pCVar7->m_ClCameraSmoothness) {
      fVar15 = ((float)pCVar7->m_ClCameraSmoothness / -100.0 + 1.0) * 9.5 + 0.5;
      OnRender::s_SpeedBias = fVar15 * fVar17 + OnRender::s_SpeedBias;
      if (pCVar7->m_ClDynamicCamera == 0) {
        OnRender::s_SpeedBias = 5.0;
        if (5.0 <= fVar15) {
          OnRender::s_SpeedBias = fVar15;
        }
      }
      else {
        fVar12 = (pCVar4->m_pControls->m_MousePos).field_0.x - OnRender::s_LastMousePos.field_0.x;
        fVar16 = (pCVar4->m_pControls->m_MousePos).field_1.y - OnRender::s_LastMousePos.field_1.y;
        fVar8 = log10f((float)pCVar7->m_ClCameraStabilizing / 100.0 + 1.0);
        fVar8 = fVar8 * SQRT(fVar12 * fVar12 + fVar16 * fVar16) * -0.02 + OnRender::s_SpeedBias;
        if (fVar8 <= fVar15) {
          fVar15 = fVar8;
        }
        pCVar4 = (this->super_CComponent).m_pClient;
        pCVar7 = pCVar4->m_pConfig;
        OnRender::s_SpeedBias =
             (float)(-(uint)(fVar8 < 0.5) & 0x3f000000 | ~-(uint)(fVar8 < 0.5) & (uint)fVar15);
      }
    }
    OnRender::s_LastMousePos = pCVar4->m_pControls->m_MousePos;
    vVar14.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    vVar14.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    if ((pCVar7->m_ClDynamicCamera != 0) &&
       (fVar15 = SQRT(OnRender::s_LastMousePos.field_0.x * OnRender::s_LastMousePos.field_0.x +
                      OnRender::s_LastMousePos.field_1.y * OnRender::s_LastMousePos.field_1.y),
       0.0001 < fVar15)) {
      fVar15 = fVar15 - (float)pCVar7->m_ClMouseDeadzone;
      if (fVar15 <= 0.0) {
        fVar15 = 0.0;
      }
      fVar15 = fVar15 * ((float)pCVar7->m_ClMouseFollowfactor / 100.0);
      vVar10 = normalize(&pCVar4->m_pControls->m_MousePos);
      vVar14.field_0.x = fVar15 * vVar10.field_0.x;
      vVar14.field_1.y = fVar15 * vVar10.field_1.y;
      pCVar4 = (this->super_CComponent).m_pClient;
      pCVar7 = pCVar4->m_pConfig;
    }
    if (0 < pCVar7->m_ClCameraSmoothness) {
      fVar17 = fVar17 * OnRender::s_SpeedBias;
      if (1.0 <= fVar17) {
        fVar17 = 1.0;
      }
      aVar11 = vVar14.field_1;
      vVar14.field_0.x =
           fVar17 * (vVar14.field_0.x - OnRender::s_CurrentCameraOffset.field_0.x) +
           OnRender::s_CurrentCameraOffset.field_0.x;
      vVar14.field_1.y =
           fVar17 * (aVar11.y - OnRender::s_CurrentCameraOffset.field_1.y) +
           OnRender::s_CurrentCameraOffset.field_1.y;
    }
    if ((pCVar4->m_Snap).m_SpecInfo.m_Active == true) {
      vVar1 = (pCVar4->m_Snap).m_SpecInfo.m_Position;
    }
    else {
      vVar1 = pCVar4->m_LocalCharacterPos;
    }
    vVar5.field_0.x = vVar1.field_0.x + vVar14.field_0.x;
    vVar5.field_1.y = vVar1.field_1.y + vVar14.field_1.y;
    OnRender::s_CurrentCameraOffset = vVar14;
  }
  else {
    this->m_Zoom = 0.7;
    if ((OnRender()::Dir == '\0') && (iVar3 = __cxa_guard_acquire(&OnRender()::Dir), iVar3 != 0)) {
      OnRender::Dir.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x3f800000;
      OnRender::Dir.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
      __cxa_guard_release(&OnRender()::Dir);
    }
    fVar17 = distance<float>(&this->m_Center,&this->m_RotationCenter);
    pCVar4 = (this->super_CComponent).m_pClient;
    pCVar7 = pCVar4->m_pConfig;
    fVar15 = (float)pCVar7->m_ClRotationRadius;
    if (fVar17 <= fVar15 + 0.5) {
      OnRender::Dir =
           rotate<float>(&OnRender::Dir,
                         (360.0 / (float)pCVar7->m_ClRotationSpeed) *
                         pCVar4->m_pClient->m_RenderFrameTime);
      fVar17 = (float)((this->super_CComponent).m_pClient)->m_pConfig->m_ClRotationRadius;
      vVar5.field_0.x = (this->m_RotationCenter).field_0.x + fVar17 * OnRender::Dir.field_0.x;
      vVar5.field_1.y = (this->m_RotationCenter).field_1.y + fVar17 * OnRender::Dir.field_1.y;
      this->m_Center = vVar5;
      goto LAB_0012c6cc;
    }
    aVar9 = (this->m_AnimationStartPos).field_0;
    aVar13 = (this->m_RotationCenter).field_0;
    auVar18._0_4_ = aVar9.x - aVar13.x;
    aVar11 = (this->m_RotationCenter).field_1;
    aVar20 = (this->m_AnimationStartPos).field_1;
    auVar18._4_4_ = aVar20.y - aVar11.y;
    auVar18._8_8_ = 0;
    auVar19._0_4_ = SQRT(auVar18._0_4_ * auVar18._0_4_ + auVar18._4_4_ * auVar18._4_4_);
    auVar19._4_4_ = auVar19._0_4_;
    auVar19._8_4_ = auVar19._0_4_;
    auVar19._12_4_ = auVar19._0_4_;
    auVar19 = divps(auVar18,auVar19);
    OnRender::Dir = auVar19._0_8_;
    fVar17 = ((float)pCVar7->m_ClCameraSpeed * pCVar4->m_pClient->m_RenderFrameTime) / 10.0 +
             this->m_MoveTime;
    this->m_MoveTime = fVar17;
    fVar17 = powf(1.0 - fVar17,7.0);
    local_28 = auVar19._0_4_;
    fStack_24 = auVar19._4_4_;
    fVar8 = fVar15 * local_28 + aVar13.x;
    fVar15 = fVar15 * fStack_24 + aVar11.y;
    fVar12 = aVar9.x - fVar8;
    fVar16 = aVar20.y - fVar15;
    fVar17 = SQRT(fVar12 * fVar12 + fVar16 * fVar16) * fVar17;
    vVar5.field_0.x = fVar17 * OnRender::Dir.field_0.x + fVar8;
    vVar5.field_1.y = fVar17 * OnRender::Dir.field_1.y + fVar15;
  }
  this->m_Center = vVar5;
LAB_0012c6cc:
  this->m_PrevCenter = vVar5;
  return;
}

Assistant:

void CCamera::OnRender()
{
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Zoom = 1.0f;

		// update camera center
		if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition &&
			(m_pClient->m_Snap.m_SpecInfo.m_SpecMode == SPEC_FREEVIEW || (m_pClient->m_Snap.m_pLocalInfo && !(m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))))
		{
			if(m_CamType != CAMTYPE_SPEC)
			{
				m_pClient->m_pControls->m_MousePos = m_PrevCenter;
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_SPEC;
			}
			m_Center = m_pClient->m_pControls->m_MousePos;
		}
		else
		{
			if(m_CamType != CAMTYPE_PLAYER)
			{
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_PLAYER;
			}

			float DeltaTime = Client()->RenderFrameTime();
			static vec2 s_LastMousePos(0, 0);
			static vec2 s_CurrentCameraOffset(0, 0);
			static float s_SpeedBias = 0.5f;

			if(Config()->m_ClCameraSmoothness > 0)
			{
				float CameraSpeed = (1.0f - (Config()->m_ClCameraSmoothness / 100.0f)) * 9.5f + 0.5f;
				float CameraStabilizingFactor = 1 + Config()->m_ClCameraStabilizing / 100.0f;

				s_SpeedBias += CameraSpeed * DeltaTime;
				if(Config()->m_ClDynamicCamera)
				{
					s_SpeedBias -= length(m_pClient->m_pControls->m_MousePos - s_LastMousePos) * log10f(CameraStabilizingFactor) * 0.02f;
					s_SpeedBias = clamp(s_SpeedBias, 0.5f, CameraSpeed);
				}
				else
				{
					s_SpeedBias = maximum(5.0f, CameraSpeed); // make sure toggle back is fast
				}
			}

			vec2 TargetCameraOffset(0, 0);
			s_LastMousePos = m_pClient->m_pControls->m_MousePos;
			float l = length(s_LastMousePos);
			if(Config()->m_ClDynamicCamera && l > 0.0001f) // make sure that this isn't 0
			{
				float DeadZone = Config()->m_ClMouseDeadzone;
				float FollowFactor = Config()->m_ClMouseFollowfactor/100.0f;
				float OffsetAmount = maximum(l-DeadZone, 0.0f) * FollowFactor;

				TargetCameraOffset = normalize(m_pClient->m_pControls->m_MousePos)*OffsetAmount;
			}
			
			if(Config()->m_ClCameraSmoothness > 0)
				s_CurrentCameraOffset += (TargetCameraOffset - s_CurrentCameraOffset) * minimum(DeltaTime * s_SpeedBias, 1.0f);
			else
				s_CurrentCameraOffset = TargetCameraOffset;
			
			if(m_pClient->m_Snap.m_SpecInfo.m_Active)
				m_Center = m_pClient->m_Snap.m_SpecInfo.m_Position + s_CurrentCameraOffset;
			else
				m_Center = m_pClient->m_LocalCharacterPos + s_CurrentCameraOffset;
		}
	}
	else
	{
		m_Zoom = 0.7f;
		static vec2 Dir = vec2(1.0f, 0.0f);

		if(distance(m_Center, m_RotationCenter) <= (float)Config()->m_ClRotationRadius+0.5f)
		{
			// do little rotation
			float RotPerTick = 360.0f/(float)Config()->m_ClRotationSpeed * Client()->RenderFrameTime();
			Dir = rotate(Dir, RotPerTick);
			m_Center = m_RotationCenter+Dir*(float)Config()->m_ClRotationRadius;
		}
		else
		{
			// positions for the animation
			Dir = normalize(m_AnimationStartPos - m_RotationCenter);
			vec2 TargetPos = m_RotationCenter + Dir * (float)Config()->m_ClRotationRadius;
			float Distance = distance(m_AnimationStartPos, TargetPos);

			// move time
			m_MoveTime += Client()->RenderFrameTime()*Config()->m_ClCameraSpeed / 10.0f;
			float XVal = 1 - m_MoveTime;
			XVal = pow(XVal, 7.0f);

			m_Center = TargetPos + Dir * (XVal*Distance);
		}
	}

	m_PrevCenter = m_Center;
}